

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigen_Colamd.h
# Opt level: O2

void Eigen::internal::colamd_set_defaults(double *knobs)

{
  long lVar1;
  
  if (knobs != (double *)0x0) {
    for (lVar1 = 0; lVar1 != 0x14; lVar1 = lVar1 + 1) {
      knobs[lVar1] = 0.0;
    }
    *knobs = 0.5;
    knobs[1] = 0.5;
  }
  return;
}

Assistant:

static inline void colamd_set_defaults(double knobs[COLAMD_KNOBS])
{
  /* === Local variables ================================================== */
  
  int i ;

  if (!knobs)
  {
    return ;      /* no knobs to initialize */
  }
  for (i = 0 ; i < COLAMD_KNOBS ; i++)
  {
    knobs [i] = 0 ;
  }
  knobs [COLAMD_DENSE_ROW] = 0.5 ;  /* ignore rows over 50% dense */
  knobs [COLAMD_DENSE_COL] = 0.5 ;  /* ignore columns over 50% dense */
}